

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void decode_block(AV1Decoder *pbi,ThreadData *td,int mi_row,int mi_col,aom_reader *r,
                 PARTITION_TYPE partition,BLOCK_SIZE bsize)

{
  byte bVar1;
  uint8_t uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  byte bVar7;
  byte bVar8;
  uint plane_end;
  DecoderCodingBlock *dcb;
  
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
  uVar2 = ((pbi->common).seq_params)->monochrome;
  iVar4 = (pbi->common).mi_params.mi_stride;
  iVar5 = iVar4 * mi_row + mi_col;
  bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize];
  (td->dcb).xd.mi = (pbi->common).mi_params.mi_grid_base + iVar5;
  plane_end = (uint)(uVar2 == '\0') * 2 + 1;
  (td->dcb).xd.tx_type_map = (pbi->common).mi_params.tx_type_map + iVar5;
  (td->dcb).xd.tx_type_map_stride = iVar4;
  lVar6 = 0;
  do {
    bVar7 = (byte)((uint)bVar3 * 4 >>
                  (*(byte *)((long)(td->dcb).xd.plane[0].pre + lVar6 + -0x28) & 0x1f));
    bVar8 = (byte)((uint)bVar1 * 4 >>
                  (*(byte *)((long)(td->dcb).xd.plane[0].pre + lVar6 + -0x2c) & 0x1f));
    if (bVar8 < 5) {
      bVar8 = 4;
    }
    *(byte *)((long)((td->dcb).xd.plane[0].seg_iqmatrix + -1) + lVar6 + 0x90) = bVar8;
    if (bVar7 < 5) {
      bVar7 = 4;
    }
    *(byte *)((long)((td->dcb).xd.plane[0].seg_iqmatrix + -1) + lVar6 + 0x91) = bVar7;
    lVar6 = lVar6 + 0xa30;
  } while ((ulong)plane_end * 0xa30 - lVar6 != 0);
  set_mi_row_col((MACROBLOCKD *)td,&(td->dcb).xd.tile,mi_row,(uint)bVar3,mi_col,(uint)bVar1,
                 (pbi->common).mi_params.mi_rows,(pbi->common).mi_params.mi_cols);
  av1_setup_dst_planes
            ((td->dcb).xd.plane,bsize,&((pbi->common).cur_frame)->buf,mi_row,mi_col,0,plane_end);
  decode_token_recon_block(pbi,td,r,bsize);
  return;
}

Assistant:

static inline void decode_block(AV1Decoder *const pbi, ThreadData *const td,
                                int mi_row, int mi_col, aom_reader *r,
                                PARTITION_TYPE partition, BLOCK_SIZE bsize) {
  (void)partition;
  set_offsets_for_pred_and_recon(pbi, td, mi_row, mi_col, bsize);
  decode_token_recon_block(pbi, td, r, bsize);
}